

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingNegativeCase::generateShaders
          (SSBOBindingNegativeCase *this)

{
  TestType TVar1;
  ShaderType SVar2;
  uint uVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  ShaderProgram *this_00;
  uint uVar6;
  char *pcVar7;
  string *psVar8;
  int declNdx;
  ulong uVar9;
  allocator<char> local_b58;
  allocator<char> local_b57;
  allocator<char> local_b56;
  allocator<char> local_b55;
  allocator<char> local_b54;
  allocator<char> local_b53;
  allocator<char> local_b52;
  allocator<char> local_b51;
  string *local_b50;
  undefined1 local_b48 [40];
  ulong local_b20;
  ulong local_b18;
  string local_b10;
  string local_af0;
  undefined1 local_ad0 [40];
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  undefined1 local_928 [176];
  pointer local_878;
  undefined1 uStack_870;
  undefined7 uStack_86f;
  undefined1 uStack_868;
  undefined8 uStack_867;
  ProgramSources sources;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertexUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragmentUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessCtrlUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessEvalUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
  TVar1 = (this->super_LayoutBindingNegativeCase).m_testType;
  local_b20 = (ulong)TVar1;
  uVar3 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  uVar6 = TVar1 - TESTTYPE_BINDING_ARRAY;
  uVar9 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_b18 = 1;
  if (1 < uVar6) {
    local_b18 = (ulong)uVar3;
  }
  local_b50 = &(this->super_LayoutBindingNegativeCase).m_uniformName;
  for (; local_b18 != uVar9; uVar9 = uVar9 + 1) {
    poVar4 = std::operator<<((ostream *)&vertexUniformDecl,"layout(std140, binding = ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_LayoutBindingNegativeCase).m_vertexShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9]);
    poVar4 = std::operator<<(poVar4,") buffer ");
    declNdx = (int)uVar9;
    getUniformName((string *)&sources,local_b50,declNdx);
    poVar4 = std::operator<<(poVar4,(string *)&sources);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color1;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color2;\n");
    poVar4 = std::operator<<(poVar4,"} ");
    if (uVar6 < 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"colors",&local_b51);
      getUniformName((string *)local_928,&local_948,declNdx,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"colors",&local_b52);
      getUniformName((string *)local_928,&local_968,declNdx);
    }
    poVar4 = std::operator<<(poVar4,(string *)local_928);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_928);
    if (uVar6 < 2) {
      psVar8 = &local_948;
    }
    else {
      psVar8 = &local_968;
    }
    std::__cxx11::string::~string((string *)psVar8);
    std::__cxx11::string::~string((string *)&sources);
    poVar4 = std::operator<<((ostream *)&fragmentUniformDecl,"layout(std140, binding = ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9]);
    poVar4 = std::operator<<(poVar4,") buffer ");
    getUniformName((string *)&sources,local_b50,declNdx);
    poVar4 = std::operator<<(poVar4,(string *)&sources);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color1;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color2;\n");
    poVar4 = std::operator<<(poVar4,"} ");
    if (uVar6 < 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"colors",&local_b53);
      getUniformName((string *)local_928,&local_988,declNdx,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"colors",&local_b54);
      getUniformName((string *)local_928,&local_9a8,declNdx);
    }
    poVar4 = std::operator<<(poVar4,(string *)local_928);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_928);
    if (uVar6 < 2) {
      psVar8 = &local_988;
    }
    else {
      psVar8 = &local_9a8;
    }
    std::__cxx11::string::~string((string *)psVar8);
    std::__cxx11::string::~string((string *)&sources);
    poVar4 = std::operator<<((ostream *)&tessCtrlUniformDecl,"layout(std140, binding = ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9]);
    poVar4 = std::operator<<(poVar4,") buffer ");
    getUniformName((string *)&sources,local_b50,declNdx);
    poVar4 = std::operator<<(poVar4,(string *)&sources);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color1;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color2;\n");
    poVar4 = std::operator<<(poVar4,"} ");
    if (uVar6 < 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"colors",&local_b55);
      getUniformName((string *)local_928,&local_9c8,declNdx,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"colors",&local_b56);
      getUniformName((string *)local_928,&local_9e8,declNdx);
    }
    poVar4 = std::operator<<(poVar4,(string *)local_928);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_928);
    if (uVar6 < 2) {
      psVar8 = &local_9c8;
    }
    else {
      psVar8 = &local_9e8;
    }
    std::__cxx11::string::~string((string *)psVar8);
    std::__cxx11::string::~string((string *)&sources);
    poVar4 = std::operator<<((ostream *)&tessEvalUniformDecl,"layout(std140, binding = ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_LayoutBindingNegativeCase).m_tessEvalShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9]);
    poVar4 = std::operator<<(poVar4,") buffer ");
    getUniformName((string *)&sources,local_b50,declNdx);
    poVar4 = std::operator<<(poVar4,(string *)&sources);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color1;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 color2;\n");
    poVar4 = std::operator<<(poVar4,"} ");
    if (uVar6 < 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"colors",&local_b57);
      getUniformName((string *)local_928,&local_a08,declNdx,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"colors",&local_b58);
      getUniformName((string *)local_928,&local_a28,declNdx);
    }
    poVar4 = std::operator<<(poVar4,(string *)local_928);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_928);
    if (uVar6 < 2) {
      psVar8 = &local_a08;
    }
    else {
      psVar8 = &local_a28;
    }
    std::__cxx11::string::~string((string *)psVar8);
    std::__cxx11::string::~string((string *)&sources);
  }
  for (local_b48._0_4_ = SHADERTYPE_VERTEX;
      (int)local_b48._0_4_ < (this->super_LayoutBindingNegativeCase).m_numBindings * 2;
      local_b48._0_4_ = local_b48._0_4_ + SHADERTYPE_FRAGMENT) {
    if (uVar6 < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_928,"colors",(allocator<char> *)local_ad0);
      getUniformName((string *)&sources,(string *)local_928,0,(int)local_b48._0_4_ / 2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_928,"colors",(allocator<char> *)local_ad0);
      getUniformName((string *)&sources,(string *)local_928,(int)local_b48._0_4_ / 2);
    }
    std::__cxx11::string::~string((string *)local_928);
    poVar4 = std::operator<<((ostream *)&shaderBody,"\t");
    pcVar7 = "else if";
    if (local_b48._0_4_ == SHADERTYPE_VERTEX) {
      pcVar7 = "if";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4," (u_arrayNdx == ");
    de::toString<int>((string *)local_928,(int *)local_b48);
    poVar4 = std::operator<<(poVar4,(string *)local_928);
    poVar4 = std::operator<<(poVar4,")\n");
    poVar4 = std::operator<<(poVar4,"\t{\n");
    poVar4 = std::operator<<(poVar4,"\t\tcolor = ");
    poVar4 = std::operator<<(poVar4,(string *)&sources);
    pcVar7 = ".color2";
    if ((local_b48._0_4_ & SHADERTYPE_FRAGMENT) == SHADERTYPE_VERTEX) {
      pcVar7 = ".color1";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,";\n");
    std::operator<<(poVar4,"\t}\n");
    std::__cxx11::string::~string((string *)local_928);
    std::__cxx11::string::~string((string *)&sources);
  }
  poVar4 = std::operator<<((ostream *)&shaderBody,"\telse\n");
  poVar4 = std::operator<<(poVar4,"\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar4,"\t}\n");
  memset(local_928,0,0xac);
  local_878 = (pointer)0x0;
  uStack_870 = 0;
  uStack_86f = 0;
  uStack_868 = 0;
  uStack_867 = 0;
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_a68,SVar2,&local_a88,&local_aa8);
  glu::VertexSource::VertexSource((VertexSource *)local_b48,&local_a68);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)local_928,(ShaderSource *)local_b48);
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_af0,SVar2,&local_b10,&local_a48);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_ad0,&local_af0);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_ad0);
  glu::ProgramSources::ProgramSources(&sources,pPVar5);
  std::__cxx11::string::~string((string *)(local_ad0 + 8));
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)(local_b48 + 8));
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_a88);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_928);
  if ((this->super_LayoutBindingNegativeCase).m_tessSupport == true) {
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessControlShader((string *)local_ad0,SVar2,&local_a68,&local_a88);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_928,(string *)local_ad0);
    pPVar5 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_928);
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessEvaluationShader(&local_aa8,SVar2,&local_af0,&local_b10);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_b48,&local_aa8);
    glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_b48);
    std::__cxx11::string::~string((string *)(local_b48 + 8));
    std::__cxx11::string::~string((string *)&local_aa8);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::string::~string((string *)(local_928 + 8));
    std::__cxx11::string::~string((string *)local_ad0);
    std::__cxx11::string::~string((string *)&local_a88);
    std::__cxx11::string::~string((string *)&local_a68);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_LayoutBindingNegativeCase).super_TestCase.m_context)->m_renderCtx
             ,&sources);
  glu::ProgramSources::~ProgramSources(&sources);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalUniformDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessCtrlUniformDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragmentUniformDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexUniformDecl);
  return this_00;
}

Assistant:

glu::ShaderProgram* SSBOBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(std140, binding = " << m_vertexShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		fragmentUniformDecl << "layout(std140, binding = " << m_fragmentShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessCtrlUniformDecl << "layout(std140, binding = " << m_tessCtrlShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";

		tessEvalUniformDecl << "layout(std140, binding = " << m_tessEvalShaderBinding[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}